

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgstrs.c
# Opt level: O0

void zgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int *piVar12;
  doublecomplex *pdVar13;
  void *pvVar14;
  long lVar15;
  void *pvVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  doublecomplex *Mxvec;
  doublecomplex *addr;
  long lVar21;
  int local_300;
  double ci_1;
  double cr_1;
  double ci;
  double cr;
  char msg_1 [256];
  char msg [256];
  int ii;
  flops_t solve_ops;
  doublecomplex *soln;
  doublecomplex *rhs_work;
  doublecomplex *work;
  int nrhs;
  int ldb;
  int n;
  int jcol;
  int_t iptr;
  int_t istart;
  int_t luptr;
  int_t k;
  int_t j;
  int_t i;
  int irow;
  int nsupc;
  int nsupr;
  int nrow;
  int fsupc;
  doublecomplex *Uval;
  doublecomplex *Lval;
  NCformat *Ustore;
  SCformat *Lstore;
  doublecomplex *Bmat;
  DNformat *Bstore;
  doublecomplex temp_comp;
  SuperMatrix *B_local;
  int *perm_r_local;
  int *perm_c_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  trans_t trans_local;
  
  *info = 0;
  piVar12 = (int *)B->Store;
  iVar5 = *piVar12;
  iVar6 = B->ncol;
  if (((trans == NOTRANS) || (trans == TRANS)) || (trans == CONJ)) {
    if (((L->nrow == L->ncol) && (-1 < L->nrow)) &&
       ((L->Stype == SLU_SC && ((L->Dtype == SLU_Z && (L->Mtype == SLU_TRLU)))))) {
      if ((((U->nrow == U->ncol) && (-1 < U->nrow)) && (U->Stype == SLU_NC)) &&
         ((U->Dtype == SLU_Z && (U->Mtype == SLU_TRU)))) {
        if (L->nrow < 0) {
          local_300 = 0;
        }
        else {
          local_300 = L->nrow;
        }
        if (((iVar5 < local_300) || (B->Stype != SLU_DN)) ||
           ((B->Dtype != SLU_Z || (B->Mtype != SLU_GE)))) {
          *info = -6;
        }
      }
      else {
        *info = -3;
      }
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
  if (*info == 0) {
    iVar7 = L->nrow;
    Mxvec = doublecomplexCalloc((long)iVar7 * (long)iVar6);
    if (Mxvec == (doublecomplex *)0x0) {
      sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8d,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgstrs.c");
      superlu_abort_and_exit(msg_1 + 0xf8);
    }
    addr = doublecomplexMalloc((long)iVar7);
    if (addr == (doublecomplex *)0x0) {
      sprintf((char *)&cr,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8f,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgstrs.c");
      superlu_abort_and_exit((char *)&cr);
    }
    pdVar13 = *(doublecomplex **)(piVar12 + 2);
    pvVar14 = L->Store;
    lVar15 = *(long *)((long)pvVar14 + 8);
    pvVar16 = U->Store;
    lVar17 = *(long *)((long)pvVar16 + 8);
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    if (trans == NOTRANS) {
      for (k = 0; k < iVar6; k = k + 1) {
        for (istart = 0; istart < iVar7; istart = istart + 1) {
          iVar8 = perm_r[istart];
          addr[iVar8].r = pdVar13[(long)k * (long)iVar5 + (long)istart].r;
          addr[iVar8].i = pdVar13[(long)k * (long)iVar5 + (long)istart].i;
        }
        for (istart = 0; istart < iVar7; istart = istart + 1) {
          pdVar13[(long)k * (long)iVar5 + (long)istart].r = addr[istart].r;
          pdVar13[(long)k * (long)iVar5 + (long)istart].i = addr[istart].i;
        }
      }
      for (istart = 0; istart <= *(int *)((long)pvVar14 + 4); istart = istart + 1) {
        iVar8 = *(int *)(*(long *)((long)pvVar14 + 0x30) + (long)istart * 4);
        iVar9 = *(int *)(*(long *)((long)pvVar14 + 0x20) + (long)iVar8 * 4);
        iVar18 = *(int *)(*(long *)((long)pvVar14 + 0x20) + (long)(iVar8 + 1) * 4) - iVar9;
        iVar19 = *(int *)(*(long *)((long)pvVar14 + 0x30) + (long)(istart + 1) * 4) - iVar8;
        iVar20 = iVar18 - iVar19;
        msg._252_4_ = (float)(iVar20 * 8 * iVar19 * iVar6) +
                      (float)(iVar19 * 4 * (iVar19 + -1) * iVar6) + (float)msg._252_4_;
        if (iVar19 == 1) {
          for (luptr = 0; luptr < iVar6; luptr = luptr + 1) {
            lVar21 = (long)luptr * (long)iVar5;
            iptr = *(int_t *)(*(long *)((long)pvVar14 + 0x10) + (long)iVar8 * 4);
            n = iVar9;
            while (n = n + 1, n < *(int *)(*(long *)((long)pvVar14 + 0x20) + (long)(iVar8 + 1) * 4))
            {
              iVar18 = *(int *)(*(long *)((long)pvVar14 + 0x18) + (long)n * 4);
              iptr = iptr + 1;
              dVar1 = pdVar13[lVar21 + iVar8].i;
              dVar2 = *(double *)(lVar15 + (long)iptr * 0x10);
              dVar3 = pdVar13[lVar21 + iVar8].r;
              dVar4 = *(double *)(lVar15 + (long)iptr * 0x10 + 8);
              pdVar13[lVar21 + iVar18].r =
                   pdVar13[lVar21 + iVar18].r -
                   (pdVar13[lVar21 + iVar8].r * *(double *)(lVar15 + (long)iptr * 0x10) +
                   -(pdVar13[lVar21 + iVar8].i * *(double *)(lVar15 + (long)iptr * 0x10 + 8)));
              pdVar13[lVar21 + iVar18].i =
                   pdVar13[lVar21 + iVar18].i - (dVar1 * dVar2 + dVar3 * dVar4);
            }
          }
        }
        else {
          iVar10 = *(int *)(*(long *)((long)pvVar14 + 0x10) + (long)iVar8 * 4);
          for (luptr = 0; luptr < iVar6; luptr = luptr + 1) {
            lVar21 = (long)luptr * (long)iVar5;
            zlsolve(iVar18,iVar19,(doublecomplex *)(lVar15 + (long)iVar10 * 0x10),
                    pdVar13 + lVar21 + iVar8);
            zmatvec(iVar18,iVar20,iVar19,(doublecomplex *)(lVar15 + (long)(iVar10 + iVar19) * 0x10),
                    pdVar13 + lVar21 + iVar8,Mxvec);
            n = iVar9 + iVar19;
            for (k = 0; k < iVar20; k = k + 1) {
              iVar11 = *(int *)(*(long *)((long)pvVar14 + 0x18) + (long)n * 4);
              pdVar13[lVar21 + iVar11].r = pdVar13[lVar21 + iVar11].r - Mxvec[k].r;
              pdVar13[lVar21 + iVar11].i = pdVar13[lVar21 + iVar11].i - Mxvec[k].i;
              Mxvec[k].r = 0.0;
              Mxvec[k].i = 0.0;
              n = n + 1;
            }
          }
        }
      }
      for (istart = *(int_t *)((long)pvVar14 + 4); -1 < istart; istart = istart + -1) {
        iVar8 = *(int *)(*(long *)((long)pvVar14 + 0x30) + (long)istart * 4);
        iVar9 = *(int *)(*(long *)((long)pvVar14 + 0x20) + (long)iVar8 * 4);
        iVar18 = *(int *)(*(long *)((long)pvVar14 + 0x20) + (long)(iVar8 + 1) * 4);
        iVar20 = *(int *)(*(long *)((long)pvVar14 + 0x30) + (long)(istart + 1) * 4) - iVar8;
        iVar19 = *(int *)(*(long *)((long)pvVar14 + 0x10) + (long)iVar8 * 4);
        msg._252_4_ = (float)(iVar20 * 4 * (iVar20 + 1) * iVar6) + (float)msg._252_4_;
        if (iVar20 == 1) {
          soln = pdVar13;
          for (luptr = 0; luptr < iVar6; luptr = luptr + 1) {
            z_div(soln + iVar8,soln + iVar8,(doublecomplex *)(lVar15 + (long)iVar19 * 0x10));
            soln = soln + iVar5;
          }
        }
        else {
          for (luptr = 0; luptr < iVar6; luptr = luptr + 1) {
            zusolve(iVar18 - iVar9,iVar20,(doublecomplex *)(lVar15 + (long)iVar19 * 0x10),
                    pdVar13 + (long)iVar8 + (long)luptr * (long)iVar5);
          }
        }
        for (luptr = 0; luptr < iVar6; luptr = luptr + 1) {
          lVar21 = (long)luptr * (long)iVar5;
          for (ldb = iVar8; ldb < iVar8 + iVar20; ldb = ldb + 1) {
            msg._252_4_ = (float)((*(int *)(*(long *)((long)pvVar16 + 0x18) + (long)(ldb + 1) * 4) -
                                  *(int *)(*(long *)((long)pvVar16 + 0x18) + (long)ldb * 4)) * 8) +
                          (float)msg._252_4_;
            for (k = *(int_t *)(*(long *)((long)pvVar16 + 0x18) + (long)ldb * 4);
                k < *(int *)(*(long *)((long)pvVar16 + 0x18) + (long)(ldb + 1) * 4); k = k + 1) {
              iVar9 = *(int *)(*(long *)((long)pvVar16 + 0x10) + (long)k * 4);
              dVar1 = pdVar13[lVar21 + ldb].i;
              dVar2 = *(double *)(lVar17 + (long)k * 0x10);
              dVar3 = pdVar13[lVar21 + ldb].r;
              dVar4 = *(double *)(lVar17 + (long)k * 0x10 + 8);
              pdVar13[lVar21 + iVar9].r =
                   pdVar13[lVar21 + iVar9].r -
                   (pdVar13[lVar21 + ldb].r * *(double *)(lVar17 + (long)k * 0x10) +
                   -(pdVar13[lVar21 + ldb].i * *(double *)(lVar17 + (long)k * 0x10 + 8)));
              pdVar13[lVar21 + iVar9].i =
                   pdVar13[lVar21 + iVar9].i - (dVar1 * dVar2 + dVar3 * dVar4);
            }
          }
        }
      }
      for (k = 0; k < iVar6; k = k + 1) {
        for (istart = 0; istart < iVar7; istart = istart + 1) {
          iVar8 = perm_c[istart];
          addr[istart].r = pdVar13[(long)k * (long)iVar5 + (long)iVar8].r;
          addr[istart].i = pdVar13[(long)k * (long)iVar5 + (long)iVar8].i;
        }
        for (istart = 0; istart < iVar7; istart = istart + 1) {
          pdVar13[(long)k * (long)iVar5 + (long)istart].r = addr[istart].r;
          pdVar13[(long)k * (long)iVar5 + (long)istart].i = addr[istart].i;
        }
      }
      stat->ops[0x11] = (flops_t)msg._252_4_;
    }
    else {
      for (k = 0; k < iVar6; k = k + 1) {
        for (istart = 0; istart < iVar7; istart = istart + 1) {
          iVar8 = perm_c[istart];
          addr[iVar8].r = pdVar13[(long)k * (long)iVar5 + (long)istart].r;
          addr[iVar8].i = pdVar13[(long)k * (long)iVar5 + (long)istart].i;
        }
        for (istart = 0; istart < iVar7; istart = istart + 1) {
          pdVar13[(long)k * (long)iVar5 + (long)istart].r = addr[istart].r;
          pdVar13[(long)k * (long)iVar5 + (long)istart].i = addr[istart].i;
        }
      }
      stat->ops[0x11] = 0.0;
      if (trans == TRANS) {
        for (istart = 0; istart < iVar6; istart = istart + 1) {
          sp_ztrsv("U","T","N",L,U,pdVar13 + (long)istart * (long)iVar5,stat,info);
          sp_ztrsv("L","T","U",L,U,pdVar13 + (long)istart * (long)iVar5,stat,info);
        }
      }
      else {
        for (istart = 0; istart < iVar6; istart = istart + 1) {
          sp_ztrsv("U","C","N",L,U,pdVar13 + (long)istart * (long)iVar5,stat,info);
          sp_ztrsv("L","C","U",L,U,pdVar13 + (long)istart * (long)iVar5,stat,info);
        }
      }
      for (k = 0; k < iVar6; k = k + 1) {
        for (istart = 0; istart < iVar7; istart = istart + 1) {
          iVar8 = perm_r[istart];
          addr[istart].r = pdVar13[(long)k * (long)iVar5 + (long)iVar8].r;
          addr[istart].i = pdVar13[(long)k * (long)iVar5 + (long)iVar8].i;
        }
        for (istart = 0; istart < iVar7; istart = istart + 1) {
          pdVar13[(long)k * (long)iVar5 + (long)istart].r = addr[istart].r;
          pdVar13[(long)k * (long)iVar5 + (long)istart].i = addr[istart].i;
        }
      }
    }
    superlu_free(Mxvec);
    superlu_free(addr);
  }
  else {
    msg._248_4_ = -*info;
    input_error("zgstrs",(int *)(msg + 0xf8));
  }
  return;
}

Assistant:

void
zgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    doublecomplex   alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    doublecomplex   *work_col;
#endif
    doublecomplex   temp_comp;
    DNformat *Bstore;
    doublecomplex   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    doublecomplex   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    doublecomplex   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void zprint_soln(int n, int nrhs, const doublecomplex *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_Z || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_Z || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_Z || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("zgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = doublecomplexCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = doublecomplexMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += 4 * nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 8 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			zz_mult(&temp_comp, &rhs_work[fsupc], &Lval[luptr]);
			z_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		CTRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		CGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		ztrsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		zgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			z_sub(&rhs_work[irow], &rhs_work[irow], &work_col[i]);
			work_col[i].r = 0.0;
	                work_col[i].i = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    zlsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    zmatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			z_sub(&rhs_work[irow], &rhs_work[irow], &work[i]);
			work[i].r = 0.;
	                work[i].i = 0.;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	zprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += 4 * nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    z_div(&rhs_work[fsupc], &rhs_work[fsupc], &Lval[luptr]);
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		CTRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		ztrsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    zusolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			zz_mult(&temp_comp, &rhs_work[jcol], &Uval[i]);
			z_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	zprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
        if (trans == TRANS) {
	    for (k = 0; k < nrhs; ++k) {
	        /* Multiply by inv(U'). */
	        sp_ztrsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	        /* Multiply by inv(L'). */
	        sp_ztrsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         } else { /* trans == CONJ */
            for (k = 0; k < nrhs; ++k) {                
                /* Multiply by conj(inv(U')). */
                sp_ztrsv("U", "C", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
                
                /* Multiply by conj(inv(L')). */
                sp_ztrsv("L", "C", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         }
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}